

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflags.h
# Opt level: O3

void __thiscall
QRhiGles2::trackedBufferBarrier
          (QRhiGles2 *this,QGles2CommandBuffer *cbD,QGles2Buffer *bufD,Access access)

{
  Access AVar1;
  Command *__src;
  undefined1 auVar2 [16];
  ulong uVar3;
  Command *__dest;
  int iVar4;
  
  if ((((bufD->super_QRhiBuffer).m_usage.super_QFlagsStorageHelper<QRhiBuffer::UsageFlag,_4>.
        super_QFlagsStorage<QRhiBuffer::UsageFlag>.i & 8) != 0) &&
     (AVar1 = (bufD->usageState).access, AVar1 != access)) {
    if (AVar1 - AccessStorageWrite < 3) {
      iVar4 = (cbD->commands).p;
      if (iVar4 == (cbD->commands).a) {
        uVar3 = (long)iVar4 + 0x400;
        (cbD->commands).a = (int)uVar3;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar3;
        uVar3 = 0xffffffffffffffff;
        if (SUB168(auVar2 * ZEXT816(0x68),8) == 0) {
          uVar3 = SUB168(auVar2 * ZEXT816(0x68),0);
        }
        __dest = (Command *)operator_new__(uVar3);
        __src = (cbD->commands).v;
        if (__src != (Command *)0x0) {
          memcpy(__dest,__src,(long)iVar4 * 0x68);
          operator_delete__(__src);
          iVar4 = (cbD->commands).p;
        }
        (cbD->commands).v = __dest;
      }
      else {
        __dest = (cbD->commands).v;
      }
      (cbD->commands).p = iVar4 + 1;
      __dest[iVar4].cmd = Barrier;
      __dest[iVar4].args.viewport.x = 1.22067e-41;
    }
    (bufD->usageState).access = access;
  }
  return;
}

Assistant:

constexpr inline bool testFlags(QFlags flags) const noexcept { return flags.i ? ((i & flags.i) == flags.i) : i == Int(0); }